

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O0

RsRuleSyntax * __thiscall slang::parsing::Parser::parseRsRule(Parser *this)

{
  Token closeParen_00;
  Token join_00;
  Token colonEqual_00;
  span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL> elements;
  Token openParen_00;
  Token rand_00;
  SourceRange range_00;
  Token TVar1;
  bool bVar2;
  size_type sVar3;
  RsRuleSyntax *pRVar4;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src;
  __extent_storage<18446744073709551615UL> extraout_RDX_01;
  undefined8 *in_RDI;
  Token TVar5;
  SourceRange SVar6;
  RsCodeBlockSyntax *codeBlock;
  ExpressionSyntax *weight;
  Token colonEqual;
  RsWeightClauseSyntax *weightClause;
  SourceRange range;
  RsProdSyntax *prod;
  SmallVector<slang::syntax::RsProdSyntax_*,_5UL> prods;
  Token closeParen;
  ExpressionSyntax *expr;
  Token openParen;
  ParenthesizedExpressionSyntax *parenExpr;
  Token join;
  Token rand;
  RandJoinClauseSyntax *randJoin;
  ParenthesizedExpressionSyntax *in_stack_fffffffffffffd38;
  Parser *in_stack_fffffffffffffd40;
  SyntaxList<slang::syntax::RsProdSyntax> *this_00;
  undefined6 in_stack_fffffffffffffd48;
  undefined6 uVar7;
  TokenKind in_stack_fffffffffffffd4e;
  undefined2 uVar8;
  ParserBase *in_stack_fffffffffffffd50;
  __extent_storage<18446744073709551615UL> this_01;
  ParserBase *in_stack_fffffffffffffd58;
  SourceLocation in_stack_fffffffffffffd60;
  SourceLocation in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd70;
  DiagCode in_stack_fffffffffffffd74;
  undefined7 in_stack_fffffffffffffd90;
  undefined1 in_stack_fffffffffffffd97;
  undefined8 in_stack_fffffffffffffdc8;
  TokenKind kind;
  ParserBase *in_stack_fffffffffffffdd0;
  SourceLocation in_stack_fffffffffffffde0;
  bitmask<slang::parsing::detail::ExpressionOptions> local_19c;
  ExpressionSyntax *local_198;
  Token local_190;
  Parser *in_stack_fffffffffffffe80;
  SourceRange local_148;
  SourceLocation local_138;
  SourceLocation local_130;
  SourceRange local_128;
  SourceRange local_118;
  SourceRange local_108;
  undefined4 local_f8;
  RsProdSyntax *local_e8;
  SmallVectorBase<slang::syntax::RsProdSyntax_*> local_e0 [2];
  undefined8 local_a0;
  Info *local_98;
  undefined8 local_90;
  Info *local_88;
  undefined8 local_80;
  Info *local_78;
  undefined8 local_70;
  Info *local_68;
  Token local_60;
  ExpressionSyntax *local_50;
  Token local_48;
  ParenthesizedExpressionSyntax *local_38;
  Token local_30;
  Token in_stack_ffffffffffffffe0;
  RandJoinClauseSyntax *local_10;
  
  kind = (TokenKind)((ulong)in_stack_fffffffffffffdc8 >> 0x30);
  local_10 = (RandJoinClauseSyntax *)0x0;
  bVar2 = ParserBase::peek(in_stack_fffffffffffffd50,in_stack_fffffffffffffd4e);
  if (bVar2) {
    in_stack_ffffffffffffffe0 = ParserBase::consume((ParserBase *)in_stack_fffffffffffffd60);
    local_30 = ParserBase::expect(in_stack_fffffffffffffdd0,kind);
    local_38 = (ParenthesizedExpressionSyntax *)0x0;
    bVar2 = ParserBase::peek(in_stack_fffffffffffffd50,in_stack_fffffffffffffd4e);
    if (bVar2) {
      local_48 = ParserBase::consume((ParserBase *)in_stack_fffffffffffffd60);
      local_50 = parseExpression(in_stack_fffffffffffffd40);
      TVar5 = ParserBase::expect(in_stack_fffffffffffffdd0,kind);
      TVar1 = local_48;
      local_70._0_2_ = local_48.kind;
      local_70._2_1_ = local_48._2_1_;
      local_70._3_1_ = local_48.numFlags.raw;
      local_70._4_4_ = local_48.rawLen;
      local_48.info = TVar1.info;
      local_68 = local_48.info;
      local_60._0_8_ = TVar5._0_8_;
      local_80._0_2_ = local_60.kind;
      local_80._2_1_ = local_60._2_1_;
      local_80._3_1_ = local_60.numFlags.raw;
      local_80._4_4_ = local_60.rawLen;
      local_60.info = TVar5.info;
      local_78 = local_60.info;
      openParen_00.info = (Info *)in_stack_fffffffffffffd60;
      openParen_00._0_8_ = in_stack_fffffffffffffd58;
      closeParen_00.rawLen._2_2_ = in_stack_fffffffffffffd4e;
      closeParen_00._0_6_ = in_stack_fffffffffffffd48;
      closeParen_00.info = (Info *)in_stack_fffffffffffffd50;
      local_60 = TVar5;
      local_48 = TVar1;
      local_38 = slang::syntax::SyntaxFactory::parenthesizedExpression
                           ((SyntaxFactory *)in_stack_fffffffffffffd40,openParen_00,
                            (ExpressionSyntax *)in_stack_fffffffffffffd38,closeParen_00);
    }
    TVar1 = local_30;
    local_90 = in_stack_ffffffffffffffe0._0_8_;
    local_88 = in_stack_ffffffffffffffe0.info;
    local_a0._0_2_ = local_30.kind;
    local_a0._2_1_ = local_30._2_1_;
    local_a0._3_1_ = local_30.numFlags.raw;
    local_a0._4_4_ = local_30.rawLen;
    local_30.info = TVar1.info;
    local_98 = local_30.info;
    rand_00.info = (Info *)in_stack_fffffffffffffd60;
    rand_00._0_8_ = in_stack_fffffffffffffd58;
    join_00.rawLen._2_2_ = in_stack_fffffffffffffd4e;
    join_00._0_6_ = in_stack_fffffffffffffd48;
    join_00.info = (Info *)in_stack_fffffffffffffd50;
    local_30 = TVar1;
    local_10 = slang::syntax::SyntaxFactory::randJoinClause
                         ((SyntaxFactory *)in_stack_fffffffffffffd40,rand_00,join_00,
                          in_stack_fffffffffffffd38);
  }
  SmallVector<slang::syntax::RsProdSyntax_*,_5UL>::SmallVector
            ((SmallVector<slang::syntax::RsProdSyntax_*,_5UL> *)0x34717d);
  while( true ) {
    local_e8 = parseRsProd(in_stack_fffffffffffffe80);
    if (local_e8 == (RsProdSyntax *)0x0) break;
    SmallVectorBase<slang::syntax::RsProdSyntax_*>::push_back
              ((SmallVectorBase<slang::syntax::RsProdSyntax_*> *)in_stack_fffffffffffffd40,
               (RsProdSyntax **)in_stack_fffffffffffffd38);
    if ((local_10 != (RandJoinClauseSyntax *)0x0) &&
       ((local_e8->super_SyntaxNode).kind != RsProdItem)) {
      local_f8 = 0x9d0005;
      SVar6 = slang::syntax::SyntaxNode::sourceRange
                        ((SyntaxNode *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90)
                        );
      in_stack_fffffffffffffde0 = SVar6.endLoc;
      range_00.endLoc = in_stack_fffffffffffffd68;
      range_00.startLoc = in_stack_fffffffffffffd60;
      local_108 = SVar6;
      ParserBase::addDiag(in_stack_fffffffffffffd58,in_stack_fffffffffffffd74,range_00);
    }
  }
  if (local_10 != (RandJoinClauseSyntax *)0x0) {
    sVar3 = SmallVectorBase<slang::syntax::RsProdSyntax_*>::size(local_e0);
    if (sVar3 < 2) {
      local_118 = slang::syntax::SyntaxNode::sourceRange
                            ((SyntaxNode *)
                             CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
      bVar2 = SmallVectorBase<slang::syntax::RsProdSyntax_*>::empty(local_e0);
      if (!bVar2) {
        local_130 = SourceRange::start(&local_118);
        SmallVectorBase<slang::syntax::RsProdSyntax_*>::back(local_e0);
        slang::syntax::SyntaxNode::getLastToken
                  ((SyntaxNode *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
        local_148 = Token::range((Token *)in_stack_fffffffffffffd60);
        local_138 = SourceRange::end(&local_148);
        SourceRange::SourceRange(&local_128,local_130,local_138);
        local_118.endLoc = local_128.endLoc;
        local_118.startLoc = local_128.startLoc;
      }
      SVar6.endLoc = in_stack_fffffffffffffd68;
      SVar6.startLoc = in_stack_fffffffffffffd60;
      ParserBase::addDiag(in_stack_fffffffffffffd58,in_stack_fffffffffffffd74,SVar6);
    }
  }
  bVar2 = ParserBase::peek(in_stack_fffffffffffffd50,in_stack_fffffffffffffd4e);
  src = extraout_RDX;
  if (bVar2) {
    local_190 = ParserBase::consume((ParserBase *)in_stack_fffffffffffffd60);
    bitmask<slang::parsing::detail::ExpressionOptions>::bitmask(&local_19c,DisallowVectors);
    local_198 = parsePrimaryExpression
                          (in_stack_ffffffffffffffe0._0_8_,
                           (bitmask<slang::parsing::detail::ExpressionOptions>)
                           in_stack_ffffffffffffffe0.info._4_4_);
    bVar2 = ParserBase::peek(in_stack_fffffffffffffd50,in_stack_fffffffffffffd4e);
    if (bVar2) {
      parseRsCodeBlock((Parser *)in_stack_fffffffffffffde0);
    }
    colonEqual_00.rawLen._2_2_ = in_stack_fffffffffffffd4e;
    colonEqual_00._0_6_ = in_stack_fffffffffffffd48;
    colonEqual_00.info = (Info *)in_stack_fffffffffffffd50;
    slang::syntax::SyntaxFactory::rsWeightClause
              ((SyntaxFactory *)in_stack_fffffffffffffd40,colonEqual_00,
               (ExpressionSyntax *)in_stack_fffffffffffffd38,(RsProdSyntax *)0x347584);
    src = extraout_RDX_00;
  }
  this_00 = (SyntaxList<slang::syntax::RsProdSyntax> *)(in_RDI + 0x1c);
  uVar7 = SUB86(local_10,0);
  uVar8 = (undefined2)((ulong)local_10 >> 0x30);
  SmallVectorBase<slang::syntax::RsProdSyntax_*>::copy(local_e0,(EVP_PKEY_CTX *)*in_RDI,src);
  elements._M_ptr._6_2_ = uVar8;
  elements._M_ptr._0_6_ = uVar7;
  elements._M_extent._M_extent_value = extraout_RDX_01._M_extent_value;
  this_01._M_extent_value = extraout_RDX_01._M_extent_value;
  slang::syntax::SyntaxList<slang::syntax::RsProdSyntax>::SyntaxList(this_00,elements);
  pRVar4 = slang::syntax::SyntaxFactory::rsRule
                     ((SyntaxFactory *)this_01._M_extent_value,
                      (RandJoinClauseSyntax *)CONCAT26(uVar8,uVar7),this_00,
                      (RsWeightClauseSyntax *)in_stack_fffffffffffffd38);
  SmallVector<slang::syntax::RsProdSyntax_*,_5UL>::~SmallVector
            ((SmallVector<slang::syntax::RsProdSyntax_*,_5UL> *)0x347643);
  return pRVar4;
}

Assistant:

RsRuleSyntax& Parser::parseRsRule() {
    RandJoinClauseSyntax* randJoin = nullptr;
    if (peek(TokenKind::RandKeyword)) {
        auto rand = consume();
        auto join = expect(TokenKind::JoinKeyword);

        ParenthesizedExpressionSyntax* parenExpr = nullptr;
        if (peek(TokenKind::OpenParenthesis)) {
            auto openParen = consume();
            auto& expr = parseExpression();
            auto closeParen = expect(TokenKind::CloseParenthesis);
            parenExpr = &factory.parenthesizedExpression(openParen, expr, closeParen);
        }

        randJoin = &factory.randJoinClause(rand, join, parenExpr);
    }

    SmallVector<RsProdSyntax*> prods;
    while (true) {
        auto prod = parseRsProd();
        if (!prod)
            break;

        prods.push_back(prod);
        if (randJoin && prod->kind != SyntaxKind::RsProdItem)
            addDiag(diag::RandJoinProdItem, prod->sourceRange());
    }

    if (randJoin && prods.size() < 2) {
        SourceRange range = randJoin->sourceRange();
        if (!prods.empty())
            range = SourceRange{range.start(), prods.back()->getLastToken().range().end()};

        addDiag(diag::RandJoinNotEnough, range);
    }

    RsWeightClauseSyntax* weightClause = nullptr;
    if (peek(TokenKind::ColonEquals)) {
        auto colonEqual = consume();
        auto& weight = parsePrimaryExpression(ExpressionOptions::DisallowVectors);

        RsCodeBlockSyntax* codeBlock = nullptr;
        if (peek(TokenKind::OpenBrace))
            codeBlock = &parseRsCodeBlock();

        weightClause = &factory.rsWeightClause(colonEqual, weight, codeBlock);
    }

    return factory.rsRule(randJoin, prods.copy(alloc), weightClause);
}